

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

Vec_Ptr_t * Bac_PtrTransformNtk(Vec_Ptr_t *vNtk,Vec_Ptr_t *vGatesNames)

{
  char *pcVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *vSig;
  Vec_Ptr_t *vBoxes;
  Vec_Ptr_t *p;
  
  pcVar1 = (char *)Vec_PtrEntry(vNtk,0);
  pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  vSig = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  vBoxes = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
  p = Vec_PtrAllocExact(vNtk->nSize);
  pcVar1 = Abc_UtilStrsav(pcVar1);
  Vec_PtrPush(p,pcVar1);
  pVVar2 = Bac_PtrTransformSigs(pVVar2);
  Vec_PtrPush(p,pVVar2);
  pVVar2 = Bac_PtrTransformSigs(vSig);
  Vec_PtrPush(p,pVVar2);
  pVVar2 = Vec_PtrAllocExact(0);
  Vec_PtrPush(p,pVVar2);
  pVVar2 = Bac_PtrTransformBoxes(vBoxes,vGatesNames);
  Vec_PtrPush(p,pVVar2);
  return p;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformNtk( Vec_Ptr_t * vNtk, Vec_Ptr_t * vGatesNames )
{
    char * pName = (char *)Vec_PtrEntry(vNtk, 0);
    Vec_Ptr_t * vInputs  = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
    Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
    Vec_Ptr_t * vBoxes   = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4);
    Vec_Ptr_t * vNew     = Vec_PtrAllocExact( Vec_PtrSize(vNtk) );
    Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    Vec_PtrPush( vNew, Bac_PtrTransformSigs(vInputs) );
    Vec_PtrPush( vNew, Bac_PtrTransformSigs(vOutputs) );
    Vec_PtrPush( vNew, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNew, Bac_PtrTransformBoxes(vBoxes, vGatesNames) );
    return vNew;
}